

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void Cloud_Restart(CloudManager *dd)

{
  int local_14;
  int i;
  CloudManager *dd_local;
  
  if (dd->one->s == dd->nSignCur) {
    dd->nSignCur = dd->nSignCur + 1;
    dd->one->s = dd->one->s + 1;
    for (local_14 = 0; local_14 < dd->nVars; local_14 = local_14 + 1) {
      dd->vars[local_14]->s = dd->vars[local_14]->s + 1;
    }
    dd->nNodesCur = dd->nVars + 1;
    return;
  }
  __assert_fail("dd->one->s == dd->nSignCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/cloud.c"
                ,0xa9,"void Cloud_Restart(CloudManager *)");
}

Assistant:

void Cloud_Restart( CloudManager * dd )
{
    int i;
    assert( dd->one->s == dd->nSignCur );
    dd->nSignCur++;
    dd->one->s++;
	for ( i = 0; i < dd->nVars; i++ )
		dd->vars[i]->s++;
    dd->nNodesCur = 1 + dd->nVars;
}